

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void help(void)

{
  fprintf(_stderr,
          "-a set allocrule (default none)\n-o general optimization off\n-M max level (optional)\n-p inputpath (relative or full path)\n-n feed net value (used for reinsurance)\n-O Alloc rule2 optimization off-d debug\n-v version\n-h help\n"
         );
  return;
}

Assistant:

void help()
{

    fprintf(stderr,
		"-a set allocrule (default none)\n"
		"-o general optimization off\n"
        "-M max level (optional)\n"
		"-p inputpath (relative or full path)\n"
		"-n feed net value (used for reinsurance)\n"
		"-O Alloc rule2 optimization off"
		"-d debug\n"
		"-v version\n"
		"-h help\n"
	);
}